

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

double __thiscall ChebTools::ChebyshevExpansion::monotonic_solvex(ChebyshevExpansion *this,double y)

{
  int iVar1;
  Scalar *pSVar2;
  invalid_argument *this_00;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  Scalar SVar6;
  Scalar SVar7;
  double dVar8;
  double *pdVar9;
  double dVar10;
  Scalar SVar11;
  double dVar12;
  Scalar SVar13;
  Scalar in_XMM7_Qa;
  VectorXd ynodes;
  VectorXd nodes;
  double *local_68;
  anon_class_72_2_9474d211 secant;
  
  ChebyshevExpansion(&secant.e,this);
  secant.y = y;
  get_node_function_values((ChebyshevExpansion *)&ynodes);
  get_nodes_n11((ChebyshevExpansion *)&nodes);
  SVar6 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::maxCoeff<0>
                    ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&ynodes);
  SVar7 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::minCoeff<0>
                    ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&ynodes);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ynodes,0);
  dVar10 = (SVar6 - SVar7) * 1e-14;
  if (dVar10 <= ABS(*pSVar2 - y)) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ynodes,
                        CONCAT44(ynodes.
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                 m_storage.m_rows._4_4_,
                                 (int)ynodes.
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_rows) + -1);
    lVar3 = CONCAT44(ynodes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                     .m_rows._4_4_,
                     (int)ynodes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows) + -1;
    if (dVar10 <= ABS(*pSVar2 - y)) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ynodes,
                          lVar3);
      dVar10 = *pSVar2;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ynodes,0);
      lVar3 = CONCAT44(ynodes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows._4_4_,
                       (int)ynodes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows) + -1;
      if (dVar10 < *pSVar2 || dVar10 == *pSVar2) {
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ynodes,
                            lVar3);
        if (y < *pSVar2) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_00,"Argument is outside the range of the expansion");
          goto LAB_0012bfa9;
        }
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ynodes,0)
        ;
        if (*pSVar2 <= y && y != *pSVar2) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_00,"Argument is outside the range of the expansion");
          goto LAB_0012bfa9;
        }
        iVar1 = get_decreasingleftofval<Eigen::Matrix<double,_1,1,0,_1,1>>
                          (&ynodes,y,
                           (int)ynodes.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows);
      }
      else {
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ynodes,
                            lVar3);
        if (*pSVar2 <= y && y != *pSVar2) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_00,"Argument is outside the range of the expansion");
LAB_0012bfa9:
          __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ynodes,0)
        ;
        if (y < *pSVar2) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (this_00,"Argument is outside the range of the expansion");
          goto LAB_0012bfa9;
        }
        iVar1 = get_increasingleftofval<Eigen::Matrix<double,_1,1,0,_1,1>>
                          (&ynodes,y,
                           (int)ynodes.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows);
      }
      lVar3 = (long)iVar1;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&nodes,lVar3
                         );
      SVar11 = *pSVar2;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ynodes,
                          lVar3);
      dVar10 = *pSVar2;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&nodes,
                          lVar3 + 1);
      SVar13 = *pSVar2;
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ynodes,
                          lVar3 + 1);
      dVar10 = dVar10 - y;
      local_68 = (double *)(*pSVar2 - y);
      iVar1 = 0x32;
      while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
        in_XMM7_Qa = SVar13 - ((SVar13 - SVar11) * (double)local_68) / ((double)local_68 - dVar10);
        dVar8 = y_Clenshaw_xscaled(&secant.e,in_XMM7_Qa);
        pdVar9 = (double *)(dVar8 - secant.y);
        dVar12 = dVar10 * (double)pdVar9;
        dVar8 = in_XMM7_Qa;
        if (dVar12 <= 0.0) {
          dVar8 = SVar11;
        }
        uVar5 = -(ulong)(0.0 < dVar12);
        SVar13 = (Scalar)((ulong)SVar13 & uVar5 | ~uVar5 & (ulong)in_XMM7_Qa);
        if ((ABS(SVar13 - dVar8) < 1e-14) || (ABS((double)pdVar9) < 1e-14)) break;
        if (dVar12 <= 0.0) {
          local_68 = pdVar9;
        }
        dVar10 = (double)(~uVar5 & (ulong)dVar10 | (ulong)pdVar9 & uVar5);
        SVar11 = dVar8;
      }
      goto LAB_0012bcb1;
    }
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&nodes,lVar3);
  }
  else {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&nodes,0);
  }
  in_XMM7_Qa = *pSVar2;
LAB_0012bcb1:
  dVar10 = this->m_xmin;
  dVar8 = this->m_xmax;
  free(nodes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(ynodes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  ~ChebyshevExpansion(&secant.e);
  return (dVar8 + dVar10 + (dVar8 - dVar10) * in_XMM7_Qa) * 0.5;
}

Assistant:

double ChebyshevExpansion::monotonic_solvex(double y) const {
        /*
        Function is known to be monotonic, so we can shortcut some of the solving steps used
        We don't use the eigenvalue method because it is too slow
        */
        auto& e = *this;
        auto secant = [e,y](double a, double ya, double b, double yb, double yeps = 1e-14, double xeps = 1e-14) {
            double c, yc;
            for (auto i = 0; i < 50; ++i) {
                c = b - yb * (b - a) / (yb - ya);
                yc = e.y_Clenshaw_xscaled(c)-y;
                if (yc * ya > 0) {
                    a = c; ya = yc;
                }
                else {
                    b = c; yb = yc;
                }
                if (std::abs(b - a) < xeps) { break; }
                if (std::abs(yc) < yeps) { break; }
            }
            return c;
        };
        // Determine if the function is monotonically increasing or decreasing
        auto ynodes = get_node_function_values();
        auto nodes = get_nodes_n11();

        // Check if the input is equal to (to within numerical precision) an endpoint
        auto ytol = 1e-14 * (ynodes.maxCoeff() - ynodes.minCoeff());
        if (std::abs(ynodes[0] - y) < ytol)
            return unscale_x(nodes[0]);
        if (std::abs(ynodes[ynodes.size()-1] - y) < ytol)
            return unscale_x(nodes[ynodes.size() - 1]);

        bool increasing = ynodes[ynodes.size() - 1] > ynodes[0]; // Nodes go from 1 to -1 (stuck with this), but increasing says whether the value at the last *index* (x=-1) is greater than that of the first index (x=1).
        if (increasing) {
            if (y > ynodes[ynodes.size() - 1]) {
                throw std::invalid_argument("Argument is outside the range of the expansion");
            }
            if (y < ynodes[0]) {
                throw std::invalid_argument("Argument is outside the range of the expansion");
            }
        }
        else {
            if (y < ynodes[ynodes.size() - 1]) {
                throw std::invalid_argument("Argument is outside the range of the expansion");
            }
            if (y > ynodes[0]) {
                throw std::invalid_argument("Argument is outside the range of the expansion");
            }
        }

        // Interval bisection to find the Chebyshev-Lobatto nodes that bound the solution by bisection
        int N = static_cast<int>(ynodes.size());
        Eigen::Index i = (increasing) ? get_increasingleftofval(ynodes, y, N) : get_decreasingleftofval(ynodes, y, N);
        auto xscaled = secant(nodes(i), ynodes(i)-y, nodes(i + 1), ynodes(i + 1)-y);
        return unscale_x(xscaled);
    }